

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O3

void __thiscall
TEST_TestRegistry_runTwoTests_Test::testBody(TEST_TestRegistry_runTwoTests_Test *this)

{
  byte bVar1;
  TestRegistry *pTVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  
  pTVar2 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar2->_vptr_TestRegistry[2])(pTVar2,(this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1);
  pTVar2 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar2->_vptr_TestRegistry[2])(pTVar2,(this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2);
  pUVar3 = UtestShell::getCurrent();
  bVar1 = (((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1)->super_UtestShell).field_0x32;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(bVar1 ^ 1),"CHECK","!test1->hasRun_",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0xb6,pTVar4);
  pUVar3 = UtestShell::getCurrent();
  bVar1 = (((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2)->super_UtestShell).field_0x32;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(bVar1 ^ 1),"CHECK","!test2->hasRun_",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0xb7,pTVar4);
  pTVar2 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar2->_vptr_TestRegistry[5])(pTVar2,(this->super_TEST_GROUP_CppUTestGroupTestRegistry).result)
  ;
  pUVar3 = UtestShell::getCurrent();
  bVar1 = (((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1)->super_UtestShell).field_0x32;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)bVar1,"CHECK","test1->hasRun_",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0xb9,pTVar4);
  pUVar3 = UtestShell::getCurrent();
  bVar1 = (((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2)->super_UtestShell).field_0x32;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)bVar1,"CHECK","test2->hasRun_",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0xba,pTVar4);
  return;
}

Assistant:

TEST(TestRegistry, runTwoTests)
{
    myRegistry->addTest(test1);
    myRegistry->addTest(test2);
    CHECK(!test1->hasRun_);
    CHECK(!test2->hasRun_);
    myRegistry->runAllTests(*result);
    CHECK(test1->hasRun_);
    CHECK(test2->hasRun_);
}